

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::VisitAdd(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,BinaryExpr e)

{
  ExprBase in_RSI;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  BucketAccumulator<mp::EExpr> ba;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
  *in_stack_ffffffffffff8e08;
  ExprBase e_00;
  size_t in_stack_ffffffffffff8e28;
  BucketAccumulator<mp::EExpr> *in_stack_ffffffffffff8e30;
  BucketAccumulator<mp::EExpr> *in_stack_ffffffffffff8fe8;
  EExpr *in_stack_ffffffffffff8ff8;
  BucketAccumulator<mp::EExpr> *in_stack_ffffffffffff9000;
  
  e_00.impl_ = (Impl *)in_RDI;
  BucketAccumulator<mp::EExpr>::BucketAccumulator
            (in_stack_ffffffffffff8e30,in_stack_ffffffffffff8e28);
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
  ::lhs(in_stack_ffffffffffff8e08);
  BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)e_00.impl_,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_RSI.impl_,
             (type_conflict)((ulong)in_RDI >> 0x20));
  Convert2EExpr(in_RDI,(Expr)e_00.impl_);
  BucketAccumulator<mp::EExpr>::Add(in_stack_ffffffffffff9000,in_stack_ffffffffffff8ff8);
  EExpr::~EExpr((EExpr *)0x61a815);
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
  ::rhs(in_stack_ffffffffffff8e08);
  BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)e_00.impl_,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_RSI.impl_,
             (type_conflict)((ulong)in_RDI >> 0x20));
  Convert2EExpr(in_RDI,(Expr)e_00.impl_);
  BucketAccumulator<mp::EExpr>::Add(in_stack_ffffffffffff9000,in_stack_ffffffffffff8ff8);
  EExpr::~EExpr((EExpr *)0x61a878);
  BucketAccumulator<mp::EExpr>::ExtractSum(in_stack_ffffffffffff8fe8);
  BucketAccumulator<mp::EExpr>::~BucketAccumulator((BucketAccumulator<mp::EExpr> *)in_RDI);
  return (EExpr *)e_00.impl_;
}

Assistant:

EExpr VisitAdd(BinaryExpr e) {
    BucketAccumulator<EExpr> ba;
    ba.Add( Convert2EExpr(e.lhs()) );
    ba.Add( Convert2EExpr(e.rhs()) );
    return ba.ExtractSum();
  }